

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DuckDBAPISetting::ResetGlobal(DatabaseInstance *db,DBConfig *config)

{
  InvalidInputException *this;
  allocator local_39;
  string local_38;
  
  if (db == (DatabaseInstance *)0x0) {
    GetDefaultUserAgent_abi_cxx11_();
    ::std::__cxx11::string::_M_assign((string *)&(config->options).duckdb_api);
    ::std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Cannot change duckdb_api setting while database is running",
             &local_39);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DuckDBAPISetting::ResetGlobal(DatabaseInstance *db, DBConfig &config) {
	if (db) {
		throw InvalidInputException("Cannot change duckdb_api setting while database is running");
	}
	config.options.duckdb_api = GetDefaultUserAgent();
}